

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::TextureCubeView::gatherCompare
          (TextureCubeView *this,Sampler *sampler,float ref,float s,float t,float r)

{
  bool isFixedPoint_00;
  TextureFormat *format;
  float *pfVar1;
  void *in_RDX;
  float fVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  Vec4 VVar5;
  int local_84;
  int i;
  bool isFixedPoint;
  Vec4 gathered;
  Sampler noCompareSampler;
  float r_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  TextureCubeView *this_local;
  Vec4 *result;
  undefined8 uVar4;
  
  memcpy(gathered.m_data + 2,in_RDX,0x3c);
  VVar5 = gather((TextureCubeView *)&i,sampler,s,t,r,(int)&gathered + 8);
  uVar4 = VVar5.m_data._8_8_;
  format = ConstPixelBufferAccess::getFormat(*(ConstPixelBufferAccess **)&sampler->wrapR);
  isFixedPoint_00 = isFixedPointDepthTextureFormat(format);
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
    fVar2 = execCompare((Vec4 *)&i,*(CompareMode *)((long)in_RDX + 0x1c),local_84,ref,
                        isFixedPoint_00);
    pfVar1 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_84);
    uVar3 = (ulong)(uint)fVar2;
    *pfVar1 = fVar2;
  }
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)((ulong)uVar4 >> 0x20);
  VVar5.m_data[0] = (float)(int)uVar3;
  VVar5.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 TextureCubeView::gatherCompare (const Sampler& sampler, float ref, float s, float t, float r) const
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);
	DE_ASSERT(m_levels[0][0].getFormat().order == TextureFormat::D || m_levels[0][0].getFormat().order == TextureFormat::DS);
	DE_ASSERT(sampler.compareChannel == 0);

	Sampler noCompareSampler = sampler;
	noCompareSampler.compare = Sampler::COMPAREMODE_NONE;

	const Vec4 gathered			= gather(noCompareSampler, s, t, r, 0 /* component 0: depth */);
	const bool isFixedPoint		= isFixedPointDepthTextureFormat(m_levels[0][0].getFormat());
	Vec4 result;
	for (int i = 0; i < 4; i++)
		result[i] = execCompare(gathered, sampler.compare, i, ref, isFixedPoint);

	return result;
}